

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_vm.c
# Opt level: O2

gravity_callframe_t * gravity_new_callframe(gravity_vm *vm,gravity_fiber_t *fiber)

{
  gravity_callframe_t *pgVar1;
  uint uVar2;
  gravity_callframe_t *ptr;
  
  uVar2 = fiber->nframes;
  if (fiber->framesalloc == uVar2) {
    uVar2 = fiber->framesalloc * 2;
    ptr = fiber->frames;
    pgVar1 = (gravity_callframe_t *)gravity_realloc((gravity_vm *)0x0,ptr,(ulong)uVar2 * 0x30);
    if (pgVar1 == (gravity_callframe_t *)0x0) {
      report_runtime_error
                (vm,(error_type_t)ptr,"Infinite loop detected. Current execution must be aborted.");
      return (gravity_callframe_t *)0x0;
    }
    fiber->frames = pgVar1;
    fiber->framesalloc = uVar2;
    uVar2 = fiber->nframes;
  }
  else {
    pgVar1 = fiber->frames;
  }
  fiber->nframes = uVar2 + 1;
  return pgVar1 + uVar2;
}

Assistant:

static inline gravity_callframe_t *gravity_new_callframe (gravity_vm *vm, gravity_fiber_t *fiber) {
    #pragma unused(vm)

    // check if there are enough slots in the call frame and optionally create new cframes
    if (fiber->framesalloc - fiber->nframes < 1) {
        uint32_t new_size = fiber->framesalloc * 2;
        void *ptr = mem_realloc(NULL, fiber->frames, sizeof(gravity_callframe_t) * new_size);
        if (!ptr) {
            // frames reallocation failed means that there is a very high probability to be into an infinite loop
            report_runtime_error(vm, GRAVITY_ERROR_RUNTIME, "Infinite loop detected. Current execution must be aborted.");
            return NULL;
        }
        fiber->frames = (gravity_callframe_t *)ptr;
        fiber->framesalloc = new_size;
        STAT_FRAMES_REALLOCATED(vm);
    }

    // update frames counter
    ++fiber->nframes;

    // return first available cframe (-1 because I just updated the frames counter)
    return &fiber->frames[fiber->nframes - 1];
}